

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O1

void __thiscall
t_rs_generator::t_rs_generator
          (t_rs_generator *this,t_program *program,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *param_2,string *param_3)

{
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  t_generator::t_generator(&this->super_t_generator,program);
  (this->super_t_generator)._vptr_t_generator = (_func_int **)&PTR__t_rs_generator_00411b88;
  (this->gen_dir_)._M_dataplus._M_p = (pointer)&(this->gen_dir_).field_2;
  (this->gen_dir_)._M_string_length = 0;
  (this->gen_dir_).field_2._M_local_buf[0] = '\0';
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&this->f_gen_);
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(local_48,this);
  std::__cxx11::string::operator=((string *)&this->gen_dir_,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return;
}

Assistant:

t_rs_generator(
    t_program* program,
    const std::map<std::string, std::string>&,
    const std::string&
  ) : t_generator(program) {
    gen_dir_ = get_out_dir();
  }